

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

Address * readArguments(Address *__return_storage_ptr__,int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    printf("\x1b[31mWrong number of parameters!\x1b[0m\n");
    printf("Usage: %s <ip> <port>\n",*argv);
    exit(-1);
  }
  strcpy(__return_storage_ptr__->ip,argv[1]);
  iVar1 = atoi(argv[2]);
  __return_storage_ptr__->port = iVar1;
  return __return_storage_ptr__;
}

Assistant:

Address
readArguments(int argc, char** argv)
{
    Address addr;

    if (argc < 3) {
        printf("\x1b[31mWrong number of parameters!\x1b[0m\n");
        printf("Usage: %s <ip> <port>\n", argv[0]);
        exit(-1);
    }

    #if 0 
        addr.ip = argv[1];
    #else
        strcpy(addr.ip, argv[1]);
    #endif
    addr.port = atoi(argv[2]);

    return addr;
}